

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushFont(ImFont *font)

{
  int *piVar1;
  int iVar2;
  ImFont **ppIVar3;
  ImGuiContext *pIVar4;
  ImFont **__dest;
  int iVar5;
  int iVar6;
  ImGuiContext *g;
  
  pIVar4 = GImGui;
  if ((font == (ImFont *)0x0) && (font = (GImGui->IO).FontDefault, font == (ImFont *)0x0)) {
    font = *(((GImGui->IO).Fonts)->Fonts).Data;
  }
  SetCurrentFont(font);
  iVar6 = (pIVar4->FontStack).Size;
  iVar2 = (pIVar4->FontStack).Capacity;
  if (iVar6 == iVar2) {
    iVar6 = iVar6 + 1;
    if (iVar2 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar2 / 2 + iVar2;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar2 < iVar6) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImFont **)(*GImAllocatorAllocFunc)((long)iVar6 << 3,GImAllocatorUserData);
      ppIVar3 = (pIVar4->FontStack).Data;
      if (ppIVar3 != (ImFont **)0x0) {
        memcpy(__dest,ppIVar3,(long)(pIVar4->FontStack).Size << 3);
        ppIVar3 = (pIVar4->FontStack).Data;
        if ((ppIVar3 != (ImFont **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
      }
      (pIVar4->FontStack).Data = __dest;
      (pIVar4->FontStack).Capacity = iVar6;
    }
  }
  (pIVar4->FontStack).Data[(pIVar4->FontStack).Size] = font;
  (pIVar4->FontStack).Size = (pIVar4->FontStack).Size + 1;
  ImDrawList::PushTextureID(pIVar4->CurrentWindow->DrawList,font->ContainerAtlas->TexID);
  return;
}

Assistant:

void ImGui::PushFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    if (!font)
        font = GetDefaultFont();
    SetCurrentFont(font);
    g.FontStack.push_back(font);
    g.CurrentWindow->DrawList->PushTextureID(font->ContainerAtlas->TexID);
}